

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

char * __thiscall QUndoModel::index(QUndoModel *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  QUndoModel *pQVar3;
  
  if (*(long *)(__s + 0x10) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0xa9839f);
    pQVar3 = this;
  }
  else {
    pQVar3 = this;
    bVar1 = QModelIndex::isValid((QModelIndex *)this);
    if (bVar1) {
      QModelIndex::QModelIndex((QModelIndex *)0xa983bb);
    }
    else if (in_ECX == 0) {
      if ((-1 < __c) && (iVar2 = QUndoStack::count(), __c <= iVar2)) {
        QAbstractItemModel::createIndex
                  ((QAbstractItemModel *)__s,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3,this);
        return (char *)pQVar3;
      }
      QModelIndex::QModelIndex((QModelIndex *)0xa98401);
    }
    else {
      QModelIndex::QModelIndex((QModelIndex *)0xa983ce);
    }
  }
  return (char *)pQVar3;
}

Assistant:

QModelIndex QUndoModel::index(int row, int column, const QModelIndex &parent) const
{
    if (m_stack == nullptr)
        return QModelIndex();

    if (parent.isValid())
        return QModelIndex();

    if (column != 0)
        return QModelIndex();

    if (row < 0 || row > m_stack->count())
        return QModelIndex();

    return createIndex(row, column);
}